

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

MetadataHandle * __thiscall
duckdb::MetadataManager::Pin
          (MetadataHandle *__return_storage_ptr__,MetadataManager *this,MetadataPointer *pointer)

{
  mapped_type *pmVar1;
  BufferHandle local_40;
  
  local_40.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)((ulong)*pointer & 0xffffffffffffff);
  pmVar1 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->blocks,(key_type *)&local_40);
  BufferHandle::BufferHandle(&__return_storage_ptr__->handle);
  __return_storage_ptr__->pointer = *pointer;
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_40,this->buffer_manager,pmVar1);
  BufferHandle::operator=(&__return_storage_ptr__->handle,&local_40);
  BufferHandle::~BufferHandle(&local_40);
  return __return_storage_ptr__;
}

Assistant:

MetadataHandle MetadataManager::Pin(const MetadataPointer &pointer) {
	D_ASSERT(pointer.index < METADATA_BLOCK_COUNT);
	auto &block = blocks[UnsafeNumericCast<int64_t>(pointer.block_index)];

	MetadataHandle handle;
	handle.pointer.block_index = pointer.block_index;
	handle.pointer.index = pointer.index;
	handle.handle = buffer_manager.Pin(block.block);
	return handle;
}